

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsIter(Abc_Ntk_t *pNtk,int fCollectAll)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *vStack_00;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vStack;
  Vec_Ptr_t *vNodes;
  int fCollectAll_local;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(1000);
  vStack_00 = Vec_PtrAlloc(1000);
  for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_34);
    Abc_NodeSetTravIdCurrent(pAVar2);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    pAVar2 = Abc_ObjFanin0Ntk(pAVar2);
    Abc_NtkDfs_iter(vStack_00,pAVar2,vNodes_00);
  }
  if (fCollectAll != 0) {
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_34);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
         (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 == 0)) {
        Abc_NtkDfs_iter(vStack_00,pAVar2,vNodes_00);
      }
    }
  }
  Vec_PtrFree(vStack_00);
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIter( Abc_Ntk_t * pNtk, int fCollectAll )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NtkDfs_iter( vStack, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)), vNodes );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    { 
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent(pObj) )
                Abc_NtkDfs_iter( vStack, pObj, vNodes );
    }
    Vec_PtrFree( vStack );
    return vNodes;
}